

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

void NodeDumpObject(node *p,textwriter_conflict *Text)

{
  uint uVar1;
  long lVar2;
  tchar_t local_78 [8];
  node **i;
  tchar_t Element [8];
  array Children;
  textwriter_conflict Level;
  textwriter_conflict *Text_local;
  node *p_local;
  
  Text_local = (textwriter_conflict *)p;
  uVar1 = NodeClassFlags(p);
  if ((uVar1 & 0x10) == 0) {
    if (Text_local == (textwriter_conflict *)0x0) {
      __assert_fail("(const void*)(p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                    ,0x486,"void NodeDumpObject(node *, textwriter *)");
    }
    FourCCToString((tchar_t *)&i,8,*(fourcc_t *)(Text_local->CC + 8));
    TextElementBegin((textwriter_conflict *)&Children._Used,Text,(tchar_t *)&i);
    TextAttrib((textwriter_conflict *)&Children._Used,"Addr",&Text_local,0xf);
    TextSerializeNode((textwriter_conflict *)&Children._Used,(node *)Text_local,0x40000,0);
    p_local = (node *)Element;
    Element[0] = '\0';
    Element[1] = '\0';
    Element[2] = '\0';
    Element[3] = '\0';
    Element[4] = '\0';
    Element[5] = '\0';
    Element[6] = '\0';
    Element[7] = '\0';
    Children._Begin = (char *)0x0;
    if (Text_local == (textwriter_conflict *)0x0) {
      __assert_fail("(const void*)(p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                    ,0x48b,"void NodeDumpObject(node *, textwriter *)");
    }
    lVar2 = (**(code **)(Text_local->CC + 0x18))(Text_local,0xd,Element,0x10);
    if (lVar2 == 0) {
      local_78[0] = Element[0];
      local_78[1] = Element[1];
      local_78[2] = Element[2];
      local_78[3] = Element[3];
      local_78[4] = Element[4];
      local_78[5] = Element[5];
      local_78[6] = Element[6];
      local_78[7] = Element[7];
      for (; local_78 !=
             (tchar_t  [8])((long)Element + ((ulong)Children._Begin & 0xfffffffffffffff8));
          local_78 = (tchar_t  [8])((long)local_78 + 8)) {
        NodeDumpObject(*(node **)local_78,(textwriter_conflict *)&Children._Used);
      }
    }
    ArrayClear((array *)Element);
    TextElementEnd((textwriter_conflict *)&Children._Used);
  }
  return;
}

Assistant:

static void NodeDumpObject(node* p,textwriter* Text)
{
    textwriter Level;
    array Children;
    tchar_t Element[8];
    node** i;

    if (!(NodeClassFlags(p) & CFLAG_LOCAL)) // example skin UI stuff
    {
        FourCCToString(Element,TSIZEOF(Element),Node_ClassId(p));
        TextElementBegin(&Level,Text,Element);
        TextAttrib(&Level,T("Addr"),&p,TYPE_PTR);
        TextSerializeNode(&Level,p,TFLAG_NODUMP,0);
        ArrayInit(&Children);
        if (Node_GET(p,NODE_CHILDREN,&Children)==ERR_NONE)
            for (i=ARRAYBEGIN(Children,node*);i!=ARRAYEND(Children,node*);++i)
                NodeDumpObject(*i,&Level);
        ArrayClear(&Children);
        TextElementEnd(&Level);
    }
}